

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketAcceptor::onInitialize(ThreadedSocketAcceptor *this,SessionSettings *s)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  reference pSVar4;
  Dictionary *pDVar5;
  mapped_type *this_00;
  char *__rhs;
  mapped_type_conflict *pmVar6;
  pair<std::_Rb_tree_const_iterator<FIX::SessionID>,_bool> pVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  undefined1 auVar9 [12];
  int local_488;
  int local_450;
  bool local_41a;
  bool local_3ea;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  SocketException e;
  socket_handle socket;
  allocator<char> local_229;
  string local_228;
  int local_208;
  byte local_203;
  byte local_202;
  allocator<char> local_201;
  int rcvBufSize;
  allocator<char> local_1d9;
  string local_1d8;
  int local_1b8;
  byte local_1b3;
  byte local_1b2;
  allocator<char> local_1b1;
  int sendBufSize;
  allocator<char> local_189;
  string local_188;
  byte local_164;
  byte local_163;
  byte local_162;
  allocator<char> local_161;
  undefined1 local_160 [4];
  bool noDelay;
  allocator<char> local_139;
  string local_138;
  byte local_111;
  _Rb_tree_const_iterator<int> _Stack_110;
  bool reuseAddress;
  undefined1 local_108;
  int local_fc;
  _Self local_f8;
  int local_ec;
  _Self local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8;
  int local_d0;
  allocator<char> local_c9;
  string local_c8;
  Dictionary *local_a8;
  Dictionary *settings;
  _Self local_98;
  iterator i;
  undefined1 local_80 [8];
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  set<int,_std::less<int>,_std::allocator<int>_> ports;
  short port;
  SessionSettings *s_local;
  ThreadedSocketAcceptor *this_local;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             local_80,s);
  local_98._M_node =
       (_Base_ptr)
       std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::begin
                 ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *
                  )local_80);
  do {
    settings = (Dictionary *)
               std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
               ::end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                      *)local_80);
    bVar1 = std::operator!=(&local_98,(_Self *)&settings);
    if (!bVar1) {
      std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
                ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 local_80);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    pSVar4 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_98);
    pDVar5 = SessionSettings::get(s,pSVar4);
    local_a8 = pDVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"SocketAcceptPort",&local_c9);
    iVar3 = Dictionary::getInt(pDVar5,&local_c8);
    uVar2 = (ushort)iVar3;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    local_d0 = (int)(short)uVar2;
    this_00 = std::
              map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
              ::operator[](&this->m_portToSessions,&local_d0);
    pSVar4 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_98);
    pVar7 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
            insert(this_00,pSVar4);
    local_e0 = (_Base_ptr)pVar7.first._M_node;
    local_d8 = pVar7.second;
    local_ec = (int)(short)uVar2;
    local_e8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_ec);
    local_f8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator!=(&local_e8,&local_f8);
    if (!bVar1) {
      local_fc = (int)(short)uVar2;
      pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_fc);
      pDVar5 = local_a8;
      _Stack_110 = pVar8.first._M_node;
      local_108 = pVar8.second;
      std::allocator<char>::allocator();
      local_162 = 0;
      local_163 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"SocketReuseAddress",&local_139);
      bVar1 = Dictionary::has(pDVar5,&local_138);
      pDVar5 = local_a8;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_162 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_160,"SocketReuseAddress",&local_161);
        local_163 = 1;
        local_3ea = Dictionary::getBool(pDVar5,(string *)local_160);
      }
      else {
        local_3ea = true;
      }
      if ((local_163 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_160);
      }
      if ((local_162 & 1) != 0) {
        std::allocator<char>::~allocator(&local_161);
      }
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      pDVar5 = local_a8;
      local_111 = local_3ea;
      std::allocator<char>::allocator();
      local_1b2 = 0;
      local_1b3 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"SocketNodelay",&local_189);
      bVar1 = Dictionary::has(pDVar5,&local_188);
      pDVar5 = local_a8;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_1b2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sendBufSize,"SocketNodelay",&local_1b1);
        local_1b3 = 1;
        local_41a = Dictionary::getBool(pDVar5,(string *)&sendBufSize);
      }
      else {
        local_41a = false;
      }
      if ((local_1b3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&sendBufSize);
      }
      if ((local_1b2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_1b1);
      }
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      pDVar5 = local_a8;
      local_164 = local_41a;
      std::allocator<char>::allocator();
      local_202 = 0;
      local_203 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"SocketSendBufferSize",&local_1d9);
      bVar1 = Dictionary::has(pDVar5,&local_1d8);
      pDVar5 = local_a8;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_202 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rcvBufSize,"SocketSendBufferSize",&local_201);
        local_203 = 1;
        local_450 = Dictionary::getInt(pDVar5,(string *)&rcvBufSize);
      }
      else {
        local_450 = 0;
      }
      if ((local_203 & 1) != 0) {
        std::__cxx11::string::~string((string *)&rcvBufSize);
      }
      if ((local_202 & 1) != 0) {
        std::allocator<char>::~allocator(&local_201);
      }
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      pDVar5 = local_a8;
      local_1b8 = local_450;
      std::allocator<char>::allocator();
      e.super_Exception.detail.field_2._M_local_buf[0xe] = '\0';
      e.super_Exception.detail.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"SocketReceiveBufferSize",&local_229);
      bVar1 = Dictionary::has(pDVar5,&local_228);
      pDVar5 = local_a8;
      if (bVar1) {
        std::allocator<char>::allocator();
        e.super_Exception.detail.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&socket,"SocketReceiveBufferSize",
                   (allocator<char> *)(e.super_Exception.detail.field_2._M_local_buf + 0xf));
        e.super_Exception.detail.field_2._M_local_buf[0xd] = '\x01';
        local_488 = Dictionary::getInt(pDVar5,(string *)&socket);
      }
      else {
        local_488 = 0;
      }
      if ((e.super_Exception.detail.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&socket);
      }
      if ((e.super_Exception.detail.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)(e.super_Exception.detail.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      local_208 = local_488;
      e.super_Exception.detail.field_2._8_4_ =
           socket_createAcceptor((int)(short)uVar2,(bool)(local_111 & 1));
      if (e.super_Exception.detail.field_2._8_4_ == -1) {
        SocketException::SocketException((SocketException *)local_2a8);
        socket_close(e.super_Exception.detail.field_2._8_4_);
        auVar9 = __cxa_allocate_exception(0x50);
        IntConvertor::convert_abi_cxx11_(&local_348,(IntConvertor *)(ulong)uVar2,auVar9._8_4_);
        std::operator+(&local_328,"Unable to create, bind, or listen to port ",&local_348);
        std::operator+(&local_308,&local_328," (");
        __rhs = (char *)std::logic_error::what();
        std::operator+(&local_2e8,&local_308,__rhs);
        std::operator+(&local_2c8,&local_2e8,")");
        RuntimeError::RuntimeError(auVar9._0_8_,&local_2c8);
        __cxa_throw(auVar9._0_8_,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      }
      if ((local_164 & 1) != 0) {
        socket_setsockopt(e.super_Exception.detail.field_2._8_4_,1);
      }
      if (local_1b8 != 0) {
        socket_setsockopt(e.super_Exception.detail.field_2._8_4_,7,local_1b8);
      }
      if (local_208 != 0) {
        socket_setsockopt(e.super_Exception.detail.field_2._8_4_,8,local_208);
      }
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&this->m_socketToPort,
                          (key_type *)(e.super_Exception.detail.field_2._M_local_buf + 8));
      *pmVar6 = (int)(short)uVar2;
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                (&this->m_sockets,
                 (value_type_conflict1 *)(e.super_Exception.detail.field_2._M_local_buf + 8));
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_98);
  } while( true );
}

Assistant:

void ThreadedSocketAcceptor::onInitialize( const SessionSettings& s )
EXCEPT ( RuntimeError )
{
  short port = 0;
  std::set<int> ports;

  std::set<SessionID> sessions = s.getSessions();
  std::set<SessionID>::iterator i = sessions.begin();
  for( ; i != sessions.end(); ++i )
  {
    const Dictionary& settings = s.get( *i );
    port = (short)settings.getInt( SOCKET_ACCEPT_PORT );

    m_portToSessions[port].insert( *i );

    if( ports.find(port) != ports.end() )
      continue;
    ports.insert( port );

    const bool reuseAddress = settings.has( SOCKET_REUSE_ADDRESS ) ? 
      settings.getBool( SOCKET_REUSE_ADDRESS ) : true;

    const bool noDelay = settings.has( SOCKET_NODELAY ) ? 
      settings.getBool( SOCKET_NODELAY ) : false;

    const int sendBufSize = settings.has( SOCKET_SEND_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_SEND_BUFFER_SIZE ) : 0;

    const int rcvBufSize = settings.has( SOCKET_RECEIVE_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_RECEIVE_BUFFER_SIZE ) : 0;

    socket_handle socket = socket_createAcceptor( port, reuseAddress );
    if( socket == INVALID_SOCKET_HANDLE )
    {
      SocketException e;
      socket_close( socket );
      throw RuntimeError( "Unable to create, bind, or listen to port " 
                         + IntConvertor::convert( (unsigned short)port ) + " (" + e.what() + ")" );
    }
    if( noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
    if( rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );

    m_socketToPort[socket] = port;
    m_sockets.insert( socket );
  }    
}